

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

BOOL Js::JavascriptArray::GetParamForLastIndexOf
               (int64 length,Arguments *args,Var *search,int64 *fromIndex,
               ScriptContext *scriptContext)

{
  uint uVar1;
  Var pvVar2;
  int64 iVar3;
  RecyclableObject *pRVar4;
  BOOL BVar5;
  
  BVar5 = 0;
  if (length != 0) {
    uVar1 = *(uint *)&args->Info & 0xffffff;
    if (uVar1 < 3) {
      if (uVar1 == 2) {
        pRVar4 = (RecyclableObject *)Arguments::operator[](args,1);
      }
      else {
        pRVar4 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      *search = pRVar4;
      *fromIndex = length + -1;
      BVar5 = 1;
    }
    else {
      pvVar2 = Arguments::operator[](args,2);
      iVar3 = GetFromLastIndex(pvVar2,length,scriptContext);
      *fromIndex = iVar3;
      BVar5 = 0;
      if (iVar3 < length) {
        BVar5 = 1;
        pvVar2 = Arguments::operator[](args,1);
        *search = pvVar2;
      }
    }
  }
  return BVar5;
}

Assistant:

BOOL JavascriptArray::GetParamForLastIndexOf(int64 length, Arguments const & args, Var& search, int64& fromIndex, ScriptContext * scriptContext)
    {
        if (length == 0)
        {
            return false;
        }

        if (args.Info.Count > 2)
        {
            fromIndex = GetFromLastIndex(args[2], length, scriptContext);

            if (fromIndex >= length)
            {
                return false;
            }
            search = args[1];
        }
        else
        {
            search = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
            fromIndex = length - 1;
        }
        return true;
    }